

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcConversionBasedUnit::~IfcConversionBasedUnit
          (IfcConversionBasedUnit *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  LazyObject *pLVar3;
  
  *(undefined8 *)&this[-1].field_0x50 = 0x8b21c0;
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x38 = 0x8b2210;
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x8b21e8;
  puVar2 = *(undefined1 **)
            &(this->super_IfcNamedUnit).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.field_0x10;
  puVar1 = &(this->super_IfcNamedUnit).
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&this[-1].field_0x50 = 0x8b2238;
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x38 = 0x8b2260;
  pLVar3 = this[-1].ConversionFactor.obj;
  if (pLVar3 != (LazyObject *)&this[-1].field_0x78) {
    operator_delete(pLVar3,*(long *)&this[-1].field_0x78 + 1);
  }
  operator_delete(&this[-1].field_0x50,0x88);
  return;
}

Assistant:

IfcConversionBasedUnit() : Object("IfcConversionBasedUnit") {}